

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O0

bool __thiscall gl4cts::DirectStateAccess::Textures::BindUnitTest::Draw(BindUnitTest *this)

{
  code *pcVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 uVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  TestContext *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar6;
  Enum<int,_2UL> EVar7;
  Enum<int,_2UL> local_1c8 [2];
  MessageBuilder local_1a8;
  int local_28;
  uint local_24;
  GLenum error;
  GLuint i;
  Functions *gl;
  BindUnitTest *this_local;
  
  gl = (Functions *)this;
  pRVar5 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar5->_vptr_RenderContext[3])();
  _error = CONCAT44(extraout_var,iVar2);
  (**(code **)(_error + 0x1680))(this->m_po);
  dVar3 = (**(code **)(_error + 0x800))();
  glu::checkError(dVar3,"glUseProgram call has failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x1c0f);
  local_24 = 0;
  while( true ) {
    if (3 < local_24) {
      (**(code **)(_error + 0x538))(5,0,4);
      dVar3 = (**(code **)(_error + 0x800))();
      glu::checkError(dVar3,"glDrawArrays call has failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                      ,0x1c2b);
      return true;
    }
    (**(code **)(_error + 0xc0))(local_24,this->m_to[local_24]);
    local_28 = 0;
    local_28 = (**(code **)(_error + 0x800))();
    if (local_28 != 0) break;
    pcVar1 = *(code **)(_error + 0x14f0);
    uVar4 = (**(code **)(_error + 0xb48))
                      (this->m_po,*(undefined8 *)(s_fragment_shader_samplers + (ulong)local_24 * 8))
    ;
    (*pcVar1)(uVar4,local_24);
    dVar3 = (**(code **)(_error + 0x800))();
    glu::checkError(dVar3,"glGetUniformLocation or glUniform1i call has failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x1c26);
    local_24 = local_24 + 1;
  }
  this_00 = deqp::Context::getTestContext((this->super_TestCase).m_context);
  this_01 = tcu::TestContext::getLog(this_00);
  tcu::TestLog::operator<<(&local_1a8,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar6 = tcu::MessageBuilder::operator<<
                     (&local_1a8,(char (*) [46])"BindTextureUnit unexpectedly generated error ");
  EVar7 = glu::getErrorStr(local_28);
  local_1c8[0].m_getName = EVar7.m_getName;
  local_1c8[0].m_value = EVar7.m_value;
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,local_1c8);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [23])" when binding texture ");
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,this->m_to + local_24);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [18])" to texture unit ");
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_24);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [14])0x2a850ac);
  tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1a8);
  return false;
}

Assistant:

bool BindUnitTest::Draw()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Setup program. */
	gl.useProgram(m_po);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram call has failed.");

	/* Bind textures to proper units and setup program's samplers. */
	for (glw::GLuint i = 0; i < 4; ++i)
	{
		/* Tested binding funcion. */
		gl.bindTextureUnit(i, m_to[i]);

		/* Check for errors. */
		glw::GLenum error = GL_NO_ERROR;

		if (GL_NO_ERROR != (error = gl.getError()))
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message << "BindTextureUnit unexpectedly generated error " << glu::getErrorStr(error)
				<< " when binding texture " << m_to[i] << " to texture unit " << i << ". Test fails."
				<< tcu::TestLog::EndMessage;

			return false;
		}

		/* Sampler setup. */
		gl.uniform1i(gl.getUniformLocation(m_po, s_fragment_shader_samplers[i]), i);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetUniformLocation or glUniform1i call has failed.");
	}

	/* Draw call. */
	gl.drawArrays(GL_TRIANGLE_STRIP, 0, 4);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays call has failed.");

	return true;
}